

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

CATNNode<wchar_t> * __thiscall
Centaurus::CompositeATN<wchar_t>::get_node(CompositeATN<wchar_t> *this,ATNPath *path)

{
  const_iterator cVar1;
  ulong uVar2;
  ulong uVar3;
  
  cVar1 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_dict)._M_h,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  uVar3 = (ulong)(path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second;
  uVar2 = (*(long *)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
                           ._M_cur + 0x40) -
           *(long *)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
                           ._M_cur + 0x38) >> 4) * -0x3333333333333333;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    return (CATNNode<wchar_t> *)
           (*(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
                            ._M_cur + 0x38) + uVar3 * 0x50);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const CATNNode<TCHAR>& get_node(const ATNPath& path) const
    {
        return m_dict.at(path.leaf_id())[path.leaf_index()];
    }